

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception_ptr.hpp
# Opt level: O3

exception_ptr
boost::exception_detail::get_static_exception_object<boost::exception_detail::bad_alloc_>(void)

{
  atomic_int_least32_t *paVar1;
  int iVar2;
  clone_impl<boost::exception_detail::bad_alloc_> *p;
  sp_counted_base *extraout_RDX;
  sp_counted_base *extraout_RDX_00;
  shared_count sVar3;
  element_type *in_RDI;
  exception_ptr eVar4;
  clone_impl<boost::exception_detail::bad_alloc_> c;
  bad_alloc_ ba;
  clone_impl<boost::exception_detail::bad_alloc_> local_98;
  element_type *local_60;
  shared_count local_58;
  undefined1 local_50 [48];
  
  local_50._8_8_ = (error_info_container *)0x0;
  local_50._16_8_ = (char *)0x0;
  local_50._24_8_ = (char *)0x0;
  local_50._32_4_ = -1;
  local_50._0_8_ = &PTR__bad_alloc__001cb428;
  local_50._40_8_ = &PTR__bad_alloc__001cb448;
  clone_impl<boost::exception_detail::bad_alloc_>::clone_impl(&local_98,(bad_alloc_ *)local_50);
  local_98.super_bad_alloc_.super_exception.throw_function_ =
       "exception_ptr boost::exception_detail::get_static_exception_object() [Exception = boost::exception_detail::bad_alloc_]"
  ;
  local_98.super_bad_alloc_.super_exception.throw_file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/exception/detail/exception_ptr.hpp"
  ;
  local_98.super_bad_alloc_.super_exception.throw_line_ = 0x81;
  if (get_static_exception_object<boost::exception_detail::bad_alloc_>()::ep == '\0') {
    iVar2 = __cxa_guard_acquire(&get_static_exception_object<boost::exception_detail::bad_alloc_>()
                                 ::ep);
    if (iVar2 != 0) {
      p = (clone_impl<boost::exception_detail::bad_alloc_> *)operator_new(0x38);
      *(undefined ***)&p->field_0x30 = &PTR___cxa_pure_virtual_001cb0c8;
      (p->super_bad_alloc_).super_exception._vptr_exception =
           (_func_int **)&PTR___cxa_pure_virtual_001cb168;
      (p->super_bad_alloc_).super_exception.data_.px_ =
           local_98.super_bad_alloc_.super_exception.data_.px_;
      if (local_98.super_bad_alloc_.super_exception.data_.px_ != (error_info_container *)0x0) {
        (**(code **)(*(long *)local_98.super_bad_alloc_.super_exception.data_.px_ + 0x18))();
      }
      (p->super_bad_alloc_).super_exception.throw_line_ =
           local_98.super_bad_alloc_.super_exception.throw_line_;
      (p->super_bad_alloc_).super_exception.throw_function_ =
           local_98.super_bad_alloc_.super_exception.throw_function_;
      (p->super_bad_alloc_).super_exception.throw_file_ =
           local_98.super_bad_alloc_.super_exception.throw_file_;
      (p->super_bad_alloc_).super_exception._vptr_exception = (_func_int **)0x1cb4b0;
      *(undefined8 *)&(p->super_bad_alloc_).super_bad_alloc = 0x1cb4e0;
      *(undefined8 *)&p->field_0x30 = 0x1cb520;
      shared_ptr<boost::exception_detail::clone_base_const>::
      shared_ptr<boost::exception_detail::clone_impl<boost::exception_detail::bad_alloc_>>
                ((shared_ptr<boost::exception_detail::clone_base_const> *)&local_60,p);
      get_static_exception_object<boost::exception_detail::bad_alloc_>::ep.ptr_.px = local_60;
      get_static_exception_object<boost::exception_detail::bad_alloc_>::ep.ptr_.pn.pi_ =
           local_58.pi_;
      if (local_58.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_58.pi_)->use_count_ = (local_58.pi_)->use_count_ + 1;
        UNLOCK();
      }
      detail::shared_count::~shared_count(&local_58);
      __cxa_atexit(exception_ptr::~exception_ptr,
                   &get_static_exception_object<boost::exception_detail::bad_alloc_>::ep,
                   &__dso_handle);
      __cxa_guard_release(&get_static_exception_object<boost::exception_detail::bad_alloc_>()::ep);
    }
  }
  in_RDI->_vptr_clone_base =
       (_func_int **)get_static_exception_object<boost::exception_detail::bad_alloc_>::ep.ptr_.px;
  sVar3 = get_static_exception_object<boost::exception_detail::bad_alloc_>::ep.ptr_.pn;
  in_RDI[1]._vptr_clone_base =
       (_func_int **)
       get_static_exception_object<boost::exception_detail::bad_alloc_>::ep.ptr_.pn.pi_;
  if (sVar3.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    paVar1 = &(sVar3.pi_)->use_count_;
    *paVar1 = *paVar1 + 1;
    UNLOCK();
  }
  std::bad_alloc::~bad_alloc(&local_98.super_bad_alloc_.super_bad_alloc);
  local_98.super_bad_alloc_.super_exception._vptr_exception =
       (_func_int **)&PTR___cxa_pure_virtual_001cb168;
  if (local_98.super_bad_alloc_.super_exception.data_.px_ != (error_info_container *)0x0) {
    (**(code **)(*(long *)local_98.super_bad_alloc_.super_exception.data_.px_ + 0x20))();
  }
  std::bad_alloc::~bad_alloc((bad_alloc *)(local_50 + 0x28));
  local_50._0_8_ = &PTR___cxa_pure_virtual_001cb168;
  sVar3.pi_ = extraout_RDX;
  if ((error_info_container *)local_50._8_8_ != (error_info_container *)0x0) {
    (**(code **)(*(long *)local_50._8_8_ + 0x20))();
    sVar3.pi_ = extraout_RDX_00;
  }
  eVar4.ptr_.pn.pi_ = sVar3.pi_;
  eVar4.ptr_.px = in_RDI;
  return (exception_ptr)eVar4.ptr_;
}

Assistant:

exception_ptr
        get_static_exception_object()
            {
            Exception ba;
            exception_detail::clone_impl<Exception> c(ba);
#ifndef BOOST_EXCEPTION_DISABLE
            c <<
                throw_function(BOOST_CURRENT_FUNCTION) <<
                throw_file(__FILE__) <<
                throw_line(__LINE__);
#endif
            static exception_ptr ep(shared_ptr<exception_detail::clone_base const>(new exception_detail::clone_impl<Exception>(c)));
            return ep;
            }